

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O2

void Fxu_HeapDoubleMoveUp(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  Fxu_Double **pDiv2;
  uint uVar1;
  Fxu_Double **pDiv1;
  
  pDiv1 = p->pTree + pDiv->HNum;
  while( true ) {
    uVar1 = (*pDiv1)->HNum;
    if ((int)uVar1 < 2) {
      return;
    }
    uVar1 = uVar1 >> 1;
    if ((*pDiv1)->Weight <= p->pTree[uVar1]->Weight) break;
    pDiv2 = p->pTree + uVar1;
    Fxu_HeapDoubleSwap(pDiv1,pDiv2);
    pDiv1 = pDiv2;
  }
  return;
}

Assistant:

void Fxu_HeapDoubleMoveUp( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
	Fxu_Double ** ppDiv, ** ppPar;
	ppDiv = &FXU_HEAP_DOUBLE_CURRENT(p, pDiv);
	while ( FXU_HEAP_DOUBLE_PARENT_EXISTS(p,*ppDiv) )
	{
		ppPar = &FXU_HEAP_DOUBLE_PARENT(p,*ppDiv);
		if ( FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) > FXU_HEAP_DOUBLE_WEIGHT(*ppPar) )
		{
			Fxu_HeapDoubleSwap( ppDiv, ppPar );
			ppDiv = ppPar;
		}
		else
			break;
	}
}